

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLU * curl_url_dup(CURLU *in)

{
  byte bVar1;
  byte bVar2;
  Curl_URL *u;
  char *pcVar3;
  
  u = (Curl_URL *)(*Curl_ccalloc)(1,0x58);
  if (u == (Curl_URL *)0x0) {
    return (CURLU *)0x0;
  }
  if (in->scheme == (char *)0x0) {
LAB_00164bc8:
    if (in->user != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->user);
      u->user = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->password != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->password);
      u->password = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->options != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->options);
      u->options = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->host != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->host);
      u->host = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->port != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->port);
      u->port = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->path != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->path);
      u->path = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->query != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->query);
      u->query = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->fragment != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->fragment);
      u->fragment = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    if (in->zoneid != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(in->zoneid);
      u->zoneid = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00164cf9;
    }
    u->portnum = in->portnum;
    bVar2 = in->field_0x52 & 2;
    bVar1 = u->field_0x52;
    u->field_0x52 = bVar1 & 0xfd | bVar2;
    u->field_0x52 = bVar1 & 0xfc | bVar2 | in->field_0x52 & 1;
  }
  else {
    pcVar3 = (*Curl_cstrdup)(in->scheme);
    u->scheme = pcVar3;
    if (pcVar3 != (char *)0x0) goto LAB_00164bc8;
LAB_00164cf9:
    free_urlhandle(u);
    (*Curl_cfree)(u);
    u = (Curl_URL *)0x0;
  }
  return u;
}

Assistant:

CURLU *curl_url_dup(const CURLU *in)
{
  struct Curl_URL *u = calloc(1, sizeof(struct Curl_URL));
  if(u) {
    DUP(u, in, scheme);
    DUP(u, in, user);
    DUP(u, in, password);
    DUP(u, in, options);
    DUP(u, in, host);
    DUP(u, in, port);
    DUP(u, in, path);
    DUP(u, in, query);
    DUP(u, in, fragment);
    DUP(u, in, zoneid);
    u->portnum = in->portnum;
    u->fragment_present = in->fragment_present;
    u->query_present = in->query_present;
  }
  return u;
fail:
  curl_url_cleanup(u);
  return NULL;
}